

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# breadcrumb_tests.c
# Opt level: O2

TestSuite * breadcrumb_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("breadcrumb_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/breadcrumb_tests.c"
                      ,0x54);
  set_setup(pTVar1,breadcrumb_tests_setup);
  add_test_(pTVar1,"can_destroy_empty_breadcrumb",
            &CgreenSpec__Breadcrumb__can_destroy_empty_breadcrumb__);
  add_test_(pTVar1,"last_name_pushed_is_current",
            &CgreenSpec__Breadcrumb__last_name_pushed_is_current__);
  add_test_(pTVar1,"can_push_more_than_one_item",
            &CgreenSpec__Breadcrumb__can_push_more_than_one_item__);
  add_test_(pTVar1,"popping_item_takes_us_back_to_the_previous_item",
            &CgreenSpec__Breadcrumb__popping_item_takes_us_back_to_the_previous_item__);
  add_test_(pTVar1,"empty_breadcrumb_has_null_as_current",
            &CgreenSpec__Breadcrumb__empty_breadcrumb_has_null_as_current__);
  add_test_(pTVar1,"popping_last_name_leaves_breadcrumb_empty",
            &CgreenSpec__Breadcrumb__popping_last_name_leaves_breadcrumb_empty__);
  add_test_(pTVar1,"empty_breadcrumb_does_not_trigger_walker",
            &CgreenSpec__Breadcrumb__empty_breadcrumb_does_not_trigger_walker__);
  add_test_(pTVar1,"single_item_breadcrumb_does_calls_walker_only_once",
            &CgreenSpec__Breadcrumb__single_item_breadcrumb_does_calls_walker_only_once__);
  add_test_(pTVar1,"double_item_breadcrumb_does_calls_walker_only_once",
            &CgreenSpec__Breadcrumb__double_item_breadcrumb_does_calls_walker_only_once__);
  set_teardown(pTVar1,breadcrumb_tests_teardown);
  return pTVar1;
}

Assistant:

TestSuite *breadcrumb_tests(void) {
    TestSuite *suite = create_test_suite();
    set_setup(suite, breadcrumb_tests_setup);

    add_test_with_context(suite, Breadcrumb, can_destroy_empty_breadcrumb);
    add_test_with_context(suite, Breadcrumb, last_name_pushed_is_current);
    add_test_with_context(suite, Breadcrumb, can_push_more_than_one_item);
    add_test_with_context(suite, Breadcrumb, popping_item_takes_us_back_to_the_previous_item);
    add_test_with_context(suite, Breadcrumb, empty_breadcrumb_has_null_as_current);
    add_test_with_context(suite, Breadcrumb, popping_last_name_leaves_breadcrumb_empty);
    add_test_with_context(suite, Breadcrumb, empty_breadcrumb_does_not_trigger_walker);
    add_test_with_context(suite, Breadcrumb, single_item_breadcrumb_does_calls_walker_only_once);
    add_test_with_context(suite, Breadcrumb, double_item_breadcrumb_does_calls_walker_only_once);

    set_teardown(suite, breadcrumb_tests_teardown);

    return suite;
}